

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membank_factory.cpp
# Opt level: O1

MemBankList *
n_e_s::core::MemBankFactory::create_nes_mem_banks
          (MemBankList *__return_storage_ptr__,IPpu *ppu,IRom *rom,INesController *controller1,
          INesController *controller2)

{
  IMemBank *__s;
  pointer *__ptr;
  _Head_base<0UL,_n_e_s::core::IMemBank_*,_false> local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *local_38;
  _Head_base<0UL,_n_e_s::core::IMemBank_*,_false> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_head_impl = (IMemBank *)operator_new(0x10);
  (local_58._M_head_impl)->_vptr_IMemBank = (_func_int **)&PTR__IMemBank_002b1c98;
  local_58._M_head_impl[1]._vptr_IMemBank = (_func_int **)rom;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_58);
  if (local_58._M_head_impl != (IMemBank *)0x0) {
    (*(local_58._M_head_impl)->_vptr_IMemBank[1])();
  }
  __s = (IMemBank *)operator_new(0x808);
  memset(__s,0,0x808);
  __s->_vptr_IMemBank = (_func_int **)&PTR__IMemBank_002b1d58;
  memset(__s + 1,0,0x800);
  local_58._M_head_impl = __s;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_58);
  if (local_58._M_head_impl != (IMemBank *)0x0) {
    (*(local_58._M_head_impl)->_vptr_IMemBank[1])();
  }
  local_30._M_head_impl = (IMemBank *)operator_new(0x48);
  (local_30._M_head_impl)->_vptr_IMemBank = (_func_int **)&PTR__MappedMemBank_002b1dc0;
  local_30._M_head_impl[4]._vptr_IMemBank =
       (_func_int **)
       std::
       _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/membank_factory.cpp:49:12)>
       ::_M_invoke;
  local_30._M_head_impl[3]._vptr_IMemBank = (_func_int **)0x0;
  local_30._M_head_impl[1]._vptr_IMemBank = (_func_int **)ppu;
  local_30._M_head_impl[2]._vptr_IMemBank = (_func_int **)0x0;
  local_30._M_head_impl[3]._vptr_IMemBank =
       (_func_int **)
       std::
       _Function_handler<unsigned_char_(unsigned_short),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/membank_factory.cpp:49:12)>
       ::_M_manager;
  local_30._M_head_impl[5]._vptr_IMemBank = (_func_int **)0x0;
  local_30._M_head_impl[6]._vptr_IMemBank = (_func_int **)0x0;
  local_30._M_head_impl[8]._vptr_IMemBank =
       (_func_int **)
       std::
       _Function_handler<void_(unsigned_short,_unsigned_char),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/membank_factory.cpp:53:12)>
       ::_M_invoke;
  local_30._M_head_impl[5]._vptr_IMemBank = (_func_int **)ppu;
  local_30._M_head_impl[6]._vptr_IMemBank = (_func_int **)0x0;
  local_30._M_head_impl[7]._vptr_IMemBank =
       (_func_int **)
       std::
       _Function_handler<void_(unsigned_short,_unsigned_char),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/membank_factory.cpp:53:12)>
       ::_M_manager;
  uStack_40 = 0;
  local_48 = 0;
  uStack_50 = 0;
  local_38 = (MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *)0x0;
  local_58._M_head_impl = (IMemBank *)ppu;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_30);
  if (local_30._M_head_impl != (IMemBank *)0x0) {
    (*(local_30._M_head_impl)->_vptr_IMemBank[1])();
  }
  local_30._M_head_impl = (IMemBank *)0x0;
  if (local_38 !=
      (MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8> *)0x0) {
    std::
    default_delete<n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>_>
    ::operator()((default_delete<n_e_s::core::MappedMemBank<(unsigned_short)8192,_(unsigned_short)16383,_(unsigned_short)8>_>
                  *)&local_38,local_38);
  }
  local_58._M_head_impl = (IMemBank *)operator_new(0x20);
  (local_58._M_head_impl)->_vptr_IMemBank = (_func_int **)0x0;
  local_58._M_head_impl[1]._vptr_IMemBank = (_func_int **)0x0;
  local_58._M_head_impl[2]._vptr_IMemBank = (_func_int **)0x0;
  local_58._M_head_impl[3]._vptr_IMemBank = (_func_int **)0x0;
  (local_58._M_head_impl)->_vptr_IMemBank = (_func_int **)&PTR__IMemBank_002b1e28;
  local_58._M_head_impl[1]._vptr_IMemBank = (_func_int **)0x0;
  local_58._M_head_impl[2]._vptr_IMemBank = (_func_int **)0x0;
  *(undefined8 *)((long)&local_58._M_head_impl[2]._vptr_IMemBank + 6) = 0;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_58);
  if (local_58._M_head_impl != (IMemBank *)0x0) {
    (*(local_58._M_head_impl)->_vptr_IMemBank[1])();
  }
  local_58._M_head_impl = (IMemBank *)operator_new(0x20);
  (local_58._M_head_impl)->_vptr_IMemBank = (_func_int **)&PTR__IMemBank_002b1e90;
  local_58._M_head_impl[1]._vptr_IMemBank = (_func_int **)controller1;
  local_58._M_head_impl[2]._vptr_IMemBank = (_func_int **)controller2;
  local_58._M_head_impl[3]._vptr_IMemBank = (_func_int **)0x4017401600000000;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_58);
  if (local_58._M_head_impl != (IMemBank *)0x0) {
    (*(local_58._M_head_impl)->_vptr_IMemBank[1])();
  }
  local_58._M_head_impl = (IMemBank *)operator_new(0x10);
  (local_58._M_head_impl)->_vptr_IMemBank = (_func_int **)0x0;
  local_58._M_head_impl[1]._vptr_IMemBank = (_func_int **)0x0;
  (local_58._M_head_impl)->_vptr_IMemBank = (_func_int **)&PTR__IMemBank_002b1ee0;
  local_58._M_head_impl[1]._vptr_IMemBank = (_func_int **)0x0;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_58);
  if (local_58._M_head_impl != (IMemBank *)0x0) {
    (*(local_58._M_head_impl)->_vptr_IMemBank[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

MemBankList MemBankFactory::create_nes_mem_banks(IPpu *ppu,
        IRom *rom,
        INesController *controller1,
        INesController *controller2) {
    MemBankList mem_banks;

    // Rom, make sure this is first so the mapper can decide if it wants to
    // handle the address or not.
    mem_banks.push_back(std::make_unique<CpuRomTranslator>(rom));

    // Ram, repeats every 0x800 byte
    mem_banks.push_back(std::make_unique<MemBank<0x0000, 0x1FFF, 0x800>>());

    // Ppu, repeats every 0x8 byte
    mem_banks.push_back(std::make_unique<MappedMemBank<0x2000, 0x3FFF, 0x8>>(
            create_ppu_reader(ppu), create_ppu_writer(ppu)));

    // Io
    mem_banks.push_back(std::make_unique<MemBank<0x4000, 0x4015, 0x16>>());
    mem_banks.push_back(
            std::make_unique<MemBankControllerIO>(controller1, controller2));

    // Io dev
    mem_banks.push_back(std::make_unique<MemBank<0x4018, 0x401F, 0x8>>());

    return mem_banks;
}